

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  byte bVar5;
  undefined1 uVar6;
  byte *pbVar7;
  bool bVar8;
  int tok;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (ptr == end) {
    return -1;
  }
  bVar2 = ptr[1];
  if (bVar2 < 0xdc) {
    bVar5 = 7;
    if (bVar2 - 0xd8 < 4) goto LAB_0015bacf;
    if (bVar2 == 0) {
      bVar5 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      goto LAB_0015bacf;
    }
  }
  else {
    if (bVar2 - 0xdc < 4) {
      bVar5 = 8;
      goto LAB_0015bacf;
    }
    if ((bVar2 == 0xff) && (0xfd < (byte)*ptr)) {
      bVar5 = 0;
      goto LAB_0015bacf;
    }
  }
  bVar5 = 0x1d;
LAB_0015bacf:
  if (bVar5 < 0x16) {
    if (bVar5 == 5) {
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
    }
    else if (bVar5 == 6) {
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
    }
    else if ((bVar5 == 7) && ((long)end - (long)ptr < 4)) {
      return -2;
    }
  }
  else if (((bVar5 == 0x16) || (bVar5 == 0x18)) ||
          ((bVar5 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5)
                      ) >> ((byte)*ptr & 0x1f) & 1) != 0)))) {
    if (ptr + 2 == end) {
      return -1;
    }
    lVar4 = (long)end - (long)ptr;
    pbVar7 = (byte *)(ptr + 4);
LAB_0015bb7a:
    lVar4 = lVar4 + -2;
    bVar2 = pbVar7[-1];
    if (bVar2 < 0xdc) {
      uVar6 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar7[-2]);
        }
        else {
LAB_0015bbd3:
          uVar6 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      uVar6 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (pbVar7[-2] < 0xfe)) goto LAB_0015bbd3;
      uVar6 = 0;
    }
    switch(uVar6) {
    case 5:
      if (lVar4 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar4 < 3) {
        return -2;
      }
      break;
    case 7:
      if (lVar4 < 4) {
        return -2;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      iVar3 = little2_checkPiTarget
                        ((ENCODING *)ptr,(char *)(pbVar7 + -2),(char *)&local_34,
                         (int *)&switchD_0015bbef::switchdataD_001dd324);
      pbVar1 = pbVar7;
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar7 + -2);
        return 0;
      }
      goto joined_r0x0015bc86;
    case 0xf:
      iVar3 = little2_checkPiTarget
                        ((ENCODING *)ptr,(char *)(pbVar7 + -2),(char *)&local_34,
                         (int *)&switchD_0015bbef::switchdataD_001dd324);
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar7 + -2);
        return 0;
      }
      if (pbVar7 == (byte *)end) {
        return -1;
      }
      if ((pbVar7[1] != 0) || (*pbVar7 != 0x3e)) goto switchD_0015bcef_caseD_0;
      pbVar7 = pbVar7 + 2;
      goto LAB_0015bdf3;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0015bbef_caseD_16;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(pbVar7[-2] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >> (pbVar7[-2] & 0x1f)
          & 1) != 0) goto switchD_0015bbef_caseD_16;
    }
    pbVar7 = pbVar7 + -2;
    goto switchD_0015bcef_caseD_0;
  }
  *nextTokPtr = ptr;
  return 0;
switchD_0015bbef_caseD_16:
  bVar8 = pbVar7 == (byte *)end;
  pbVar7 = pbVar7 + 2;
  if (bVar8) {
    return -1;
  }
  goto LAB_0015bb7a;
joined_r0x0015bc86:
  pbVar7 = pbVar1;
  if (pbVar7 == (byte *)end) {
    return -1;
  }
  bVar2 = pbVar7[1];
  if (bVar2 < 0xdc) {
    uVar6 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar7);
      }
      else {
LAB_0015bcde:
        uVar6 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar6 = 8;
  }
  else {
    if ((bVar2 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_0015bcde;
    uVar6 = 0;
  }
  switch(uVar6) {
  case 0:
  case 1:
  case 8:
switchD_0015bcef_caseD_0:
    *nextTokPtr = (char *)pbVar7;
    return 0;
  case 5:
    if ((long)end - (long)pbVar7 < 2) {
      return -2;
    }
  default:
    pbVar1 = pbVar7 + 2;
    break;
  case 6:
    if ((long)end - (long)pbVar7 < 3) {
      return -2;
    }
    pbVar1 = pbVar7 + 3;
    break;
  case 7:
    if ((long)end - (long)pbVar7 < 4) {
      return -2;
    }
    pbVar1 = pbVar7 + 4;
    break;
  case 0xf:
    pbVar1 = pbVar7 + 2;
    if (pbVar1 == (byte *)end) {
      return -1;
    }
    if ((pbVar7[3] == 0) && (*pbVar1 == 0x3e)) {
      pbVar7 = pbVar7 + 4;
LAB_0015bdf3:
      *nextTokPtr = (char *)pbVar7;
      return local_34;
    }
  }
  goto joined_r0x0015bc86;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}